

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

int stbtt__close_shape(nk_tt_vertex *vertices,int num_vertices,int was_off,int start_off,nk_int sx,
                      nk_int sy,nk_int scx,nk_int scy,nk_int cx,nk_int cy)

{
  nk_int sy_local;
  nk_int sx_local;
  int start_off_local;
  int was_off_local;
  int num_vertices_local;
  nk_tt_vertex *vertices_local;
  
  if (start_off == 0) {
    if (was_off == 0) {
      nk_tt_setvertex(vertices + num_vertices,'\x02',sx,sy,0,0);
    }
    else {
      nk_tt_setvertex(vertices + num_vertices,'\x03',sx,sy,cx,cy);
    }
    start_off_local = num_vertices + 1;
  }
  else {
    start_off_local = num_vertices;
    if (was_off != 0) {
      start_off_local = num_vertices + 1;
      nk_tt_setvertex(vertices + num_vertices,'\x03',cx + scx >> 1,cy + scy >> 1,cx,cy);
    }
    nk_tt_setvertex(vertices + start_off_local,'\x03',sx,sy,scx,scy);
    start_off_local = start_off_local + 1;
  }
  return start_off_local;
}

Assistant:

NK_INTERN int
stbtt__close_shape(struct nk_tt_vertex *vertices, int num_vertices, int was_off,
    int start_off, nk_int sx, nk_int sy, nk_int scx, nk_int scy, nk_int cx, nk_int cy)
{
   if (start_off) {
      if (was_off)
         nk_tt_setvertex(&vertices[num_vertices++], NK_TT_vcurve, (cx+scx)>>1, (cy+scy)>>1, cx,cy);
      nk_tt_setvertex(&vertices[num_vertices++], NK_TT_vcurve, sx,sy,scx,scy);
   } else {
      if (was_off)
         nk_tt_setvertex(&vertices[num_vertices++], NK_TT_vcurve,sx,sy,cx,cy);
      else
         nk_tt_setvertex(&vertices[num_vertices++], NK_TT_vline,sx,sy,0,0);
   }
   return num_vertices;
}